

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  HRESULT HVar6;
  int iVar7;
  HRESULT HVar8;
  undefined4 *puVar9;
  ValidPointersMapTable *validTable;
  InvalidBitsTable *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  ulong uVar10;
  ushort *puVar11;
  ulong uVar12;
  char16_t *pcVar13;
  HRESULT HVar14;
  Type *pTVar15;
  bool bVar16;
  bool bVar17;
  HRESULT local_34;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0xcc,"(file != nullptr)","file != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  validTable = (ValidPointersMapTable *)malloc(0xc000);
  invalidTable = (InvalidBitsTable *)malloc(0x600);
  blockInfoTable = (BlockInfoMapTable *)malloc(0xc0);
  HVar6 = -0x7fffbffb;
  if (blockInfoTable != (BlockInfoMapTable *)0x0 &&
      (invalidTable != (InvalidBitsTable *)0x0 && validTable != (ValidPointersMapTable *)0x0)) {
    GenerateValidPointersMap(validTable,invalidTable,blockInfoTable);
    iVar5 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
    if ((-1 < iVar5) &&
       (iVar5 = PAL_fwprintf(file,
                             L"const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n"
                            ), -1 < iVar5)) {
      iVar5 = PAL_fwprintf(file,L"    {\n        ");
      if (iVar5 < 0) {
        bVar4 = false;
        local_34 = -0x7fffbffb;
        HVar6 = local_34;
      }
      else {
        puVar11 = (*validTable)[0] + 1;
        HVar8 = 0;
        bVar4 = false;
        uVar12 = 0;
        do {
          bVar16 = false;
          iVar5 = PAL_fwprintf(file,L"0x%04hX, ",(ulong)(*validTable)[uVar12][0]);
          if (iVar5 < 0) {
            HVar8 = -0x7fffbffb;
          }
          else {
            uVar1 = 0;
            do {
              uVar10 = uVar1;
              if (uVar10 == 0x1ff) goto LAB_006e93f8;
              pcVar13 = L"0x%04hX, ";
              if (uVar10 == 0x1fe) {
                pcVar13 = L"0x%04hX";
              }
              iVar5 = PAL_fwprintf(file,pcVar13,(ulong)puVar11[uVar10]);
              uVar1 = uVar10 + 1;
            } while (-1 < iVar5);
            HVar8 = -0x7fffbffb;
LAB_006e93f8:
            bVar16 = 0x1fe < uVar10;
          }
          HVar6 = HVar8;
          if (!bVar16) break;
          pcVar13 = L"\n    },\n";
          if (uVar12 == 0x2f) {
            pcVar13 = L"\n    }\n";
          }
          iVar5 = PAL_fwprintf(file,pcVar13);
          local_34 = -0x7fffbffb;
          HVar6 = local_34;
          if (iVar5 < 0) break;
          bVar4 = 0x2e < uVar12;
          HVar6 = HVar8;
          if (uVar12 + 1 == 0x30) break;
          iVar5 = PAL_fwprintf(file,L"    {\n        ");
          puVar11 = puVar11 + 0x200;
          uVar12 = uVar12 + 1;
          HVar6 = local_34;
        } while (-1 < iVar5);
      }
      local_34 = HVar6;
      HVar6 = local_34;
      if (bVar4) {
        iVar5 = PAL_fwprintf(file,L"};\n");
        HVar6 = -0x7fffbffb;
        if (((-1 < iVar5) && (iVar5 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n"), -1 < iVar5)
            ) && (iVar5 = PAL_fwprintf(file,
                                       L"const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                                      ), -1 < iVar5)) {
          iVar5 = PAL_fwprintf(file,L"    {\n        ");
          if (iVar5 < 0) {
            bVar4 = false;
LAB_006e965f:
            HVar8 = -0x7fffbffb;
          }
          else {
            pTVar15 = (*invalidTable)[0].data + 1;
            bVar4 = false;
            uVar12 = 0;
            do {
              bVar16 = false;
              iVar5 = PAL_fwprintf(file,L"0x%016I64X, ",(*invalidTable)[uVar12].data[0].word);
              HVar6 = -0x7fffbffb;
              if (-1 < iVar5) {
                uVar1 = 0;
                do {
                  uVar10 = uVar1;
                  HVar6 = local_34;
                  if (uVar10 == 3) goto LAB_006e95b3;
                  pcVar13 = L"0x%016I64X, ";
                  if (uVar10 == 2) {
                    pcVar13 = L"0x%016I64X";
                  }
                  iVar5 = PAL_fwprintf(file,pcVar13,pTVar15[uVar10].word);
                  uVar1 = uVar10 + 1;
                } while (-1 < iVar5);
                HVar6 = -0x7fffbffb;
LAB_006e95b3:
                bVar16 = 2 < uVar10;
              }
              HVar8 = HVar6;
              if (!bVar16) break;
              pcVar13 = L"\n    },\n";
              if (uVar12 == 0x2f) {
                pcVar13 = L"\n    }\n";
              }
              iVar5 = PAL_fwprintf(file,pcVar13);
              if (iVar5 < 0) goto LAB_006e965f;
              bVar4 = 0x2e < uVar12;
              if (uVar12 + 1 == 0x30) break;
              HVar8 = -0x7fffbffb;
              iVar5 = PAL_fwprintf(file,L"    {\n        ");
              pTVar15 = pTVar15 + 4;
              uVar12 = uVar12 + 1;
              local_34 = HVar6;
            } while (-1 < iVar5);
          }
          HVar6 = HVar8;
          if (bVar4) {
            iVar5 = PAL_fwprintf(file,
                                 L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n"
                                );
            HVar14 = -0x7fffbffb;
            HVar6 = -0x7fffbffb;
            if ((-1 < iVar5) &&
               (iVar5 = PAL_fwprintf(file,
                                     L"const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n"
                                    ), -1 < iVar5)) {
              iVar5 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",0,0x10);
              if (iVar5 < 0) {
                bVar4 = false;
                HVar6 = HVar14;
              }
              else {
                iVar5 = 0;
                bVar4 = false;
                uVar12 = 0;
                do {
                  iVar7 = PAL_fwprintf(file,L"    {\n");
                  HVar6 = HVar14;
                  if (iVar7 < 0) break;
                  bVar16 = true;
                  do {
                    bVar3 = bVar16;
                    if (!bVar3) break;
                    iVar7 = PAL_fwprintf(file,L"        { ");
                    if (iVar7 < 0) {
                      HVar8 = -0x7fffbffb;
                      break;
                    }
                    bVar17 = false;
                    iVar7 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",
                                         (ulong)(*blockInfoTable)[uVar12][0].lastObjectIndexOnPage,
                                         (ulong)(*blockInfoTable)[uVar12][0].pageObjectCount);
                    if (iVar7 < 0) {
                      HVar8 = -0x7fffbffb;
                    }
                    else {
                      iVar7 = PAL_fwprintf(file,L" }\n");
                      bVar17 = -1 < iVar7;
                      if (!bVar17) {
                        HVar8 = -0x7fffbffb;
                      }
                    }
                    bVar16 = false;
                  } while (bVar17);
                  HVar6 = HVar8;
                  if (bVar3) break;
                  pcVar13 = L"\n    },\n";
                  if (uVar12 == 0x2f) {
                    pcVar13 = L"\n    }\n";
                  }
                  iVar7 = PAL_fwprintf(file,pcVar13 + 1);
                  HVar6 = HVar14;
                  if (iVar7 < 0) break;
                  uVar1 = uVar12 + 1;
                  bVar4 = 0x2e < uVar12;
                  HVar6 = HVar8;
                  if (uVar1 == 0x30) break;
                  iVar5 = iVar5 + 1;
                  iVar7 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",uVar1,
                                       (ulong)(iVar5 * 0x10 + 0x10));
                  uVar12 = uVar1;
                  HVar6 = HVar14;
                } while (-1 < iVar7);
              }
              if ((bVar4) && (iVar5 = PAL_fwprintf(file,L"};\n"), iVar5 < 0)) {
                HVar6 = -0x7fffbffb;
              }
            }
          }
        }
      }
    }
  }
  free(validTable);
  free(invalidTable);
  return HVar6;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable*)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int) (HeapConstants::ObjectGranularity + (i * SmallAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < SmallAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
#if USE_FEWER_PAGES_PER_BLOCK
            IfErrorGotoCleanup(fwprintf(file, _u(" }\n")));
#else
            IfErrorGotoCleanup(fwprintf(file, (j < SmallAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
#endif
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}